

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward.c
# Opt level: O3

int32 forward(float64 **active_alpha,uint32 **active_astate,uint32 *n_active_astate,uint32 **bp,
             float64 *scale,float64 **dscale,vector_t **feature,uint32 n_obs,state_t *state_seq,
             uint32 n_state,model_inventory_t *inv,float64 beam,s3phseg_t *phseg,bw_timers_t *timers
             ,uint32 mmi_train)

{
  double *pdVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  gauden_t *g;
  acmod_set_t *acmod_set;
  float32 ***pppfVar5;
  float32 *pfVar6;
  uint32 *puVar7;
  float64 fVar8;
  double dVar9;
  acmod_id_t aVar10;
  acmod_id_t aVar11;
  void *ptr;
  float64 ***den;
  uint32 ***den_idx;
  double *ptr_00;
  undefined4 *ptr_01;
  void *ptr_02;
  uint32 *cb;
  void *__s;
  float64 *pfVar12;
  uint32 *puVar13;
  size_t sVar14;
  ulong uVar15;
  uint32 *puVar16;
  int32 iVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint32 **prev_den_idx;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  uint32 uVar24;
  size_t n_elem;
  ulong uVar25;
  uint uVar26;
  ushort uVar27;
  uint uVar28;
  uint uVar29;
  bool bVar30;
  ulong uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  double dVar34;
  double dVar35;
  void *local_100;
  ulong local_f0;
  s3phseg_t *local_e8;
  
  uVar22 = (ulong)n_state;
  uVar3 = inv->n_cb_inverse;
  uVar19 = (ulong)uVar3;
  ptr = __ckd_calloc__(uVar19,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                       ,0xe8);
  g = inv->gauden;
  acmod_set = inv->mdef->acmod_set;
  den = (float64 ***)
        __ckd_calloc_3d__(uVar19,(ulong)g->n_feat,(ulong)g->n_top,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                          ,0xee);
  den_idx = (uint32 ***)
            __ckd_calloc_3d__(uVar19,(ulong)g->n_feat,(ulong)g->n_top,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                              ,0xf0);
  pppfVar5 = inv->mixw;
  ptr_00 = (double *)
           __ckd_calloc__(uVar22,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                          ,0xf5);
  ptr_01 = (undefined4 *)
           __ckd_calloc__(uVar22,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                          ,0xf8);
  ptr_02 = __ckd_calloc__(uVar22,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                          ,0xf9);
  cb = (uint32 *)
       __ckd_calloc__(uVar22,4,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                      ,0xfc);
  __s = __ckd_calloc__(uVar22,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                       ,0x100);
  if (uVar22 != 0) {
    memset(__s,0xff,uVar22 * 2);
  }
  if (timers != (bw_timers_t *)0x0) {
    ptmr_start(&timers->gau_timer);
  }
  gauden_compute_log(den[state_seq->l_cb],den_idx[state_seq->l_cb],*feature,g,state_seq->cb,
                     (uint32 **)0x0);
  *cb = state_seq->l_cb;
  pfVar12 = gauden_scale_densities_fwd(den,den_idx,cb,1,g);
  *dscale = pfVar12;
  fVar8 = gauden_mixture(den[state_seq->l_cb],den_idx[state_seq->l_cb],pppfVar5[state_seq->mixw],g);
  uVar32 = SUB84(fVar8,0);
  uVar33 = (undefined4)((ulong)fVar8 >> 0x20);
  *ptr_00 = (double)fVar8;
  if (timers != (bw_timers_t *)0x0) {
    ptmr_stop(&timers->gau_timer);
    uVar32 = SUB84(*ptr_00,0);
    uVar33 = (undefined4)((ulong)*ptr_00 >> 0x20);
  }
  if ((double)CONCAT44(uVar33,uVar32) <= 1.199999978106707e-38) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
            ,300,"Small output prob (== %.2e) seen at frame 0 state 0\n");
    iVar17 = -1;
    local_100 = (void *)0x0;
  }
  else {
    pfVar12 = (float64 *)
              __ckd_calloc__(1,8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                             ,0x137);
    *active_alpha = pfVar12;
    puVar13 = (uint32 *)
              __ckd_calloc__(1,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                             ,0x138);
    *active_astate = puVar13;
    if (bp == (uint32 **)0x0) {
      local_100 = (void *)0x0;
    }
    else {
      puVar13 = (uint32 *)
                __ckd_calloc__(1,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                               ,0x13a);
      *bp = puVar13;
      local_100 = __ckd_calloc__(1,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                 ,0x141);
      puVar13 = *active_astate;
    }
    uVar20 = 0;
    *scale = (float64)(1.0 / *ptr_00);
    **active_alpha = 1.0;
    *puVar13 = 0;
    *n_active_astate = 1;
    *ptr_01 = 0;
    if (n_obs < 2) {
      iVar17 = 0;
    }
    else {
      uVar20 = 0;
      n_elem = 1;
      uVar22 = 1;
      local_f0 = 1;
      do {
        if (phseg == (s3phseg_t *)0x0) {
          local_e8 = (s3phseg_t *)0x0;
        }
        else {
          local_e8 = phseg;
          if (phseg->ef < uVar22) {
            local_e8 = phseg->next;
          }
        }
        uVar23 = (uint)n_elem;
        pfVar12 = (float64 *)
                  __ckd_calloc__(n_elem,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                 ,0x15d);
        active_alpha[uVar22] = pfVar12;
        if (bp != (uint32 **)0x0) {
          puVar13 = (uint32 *)
                    __ckd_calloc__(n_elem,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                   ,0x15f);
          bp[uVar22] = puVar13;
          if ((uint)local_f0 < uVar23) {
            local_100 = __ckd_realloc__(local_100,n_elem * 8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                        ,0x162);
          }
          memset(local_100,0,n_elem * 8);
        }
        if (uVar23 == 0) {
          pfVar12 = gauden_scale_densities_fwd(den,den_idx,cb,0,g);
          dscale[uVar22] = pfVar12;
LAB_0010870e:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                  ,0x263,"Best alpha < 1e-300\n");
LAB_0010872d:
          iVar17 = -1;
          goto LAB_00108741;
        }
        sVar14 = 0;
        uVar19 = 0;
        uVar21 = 0;
        local_f0 = n_elem;
        do {
          uVar26 = ptr_01[sVar14];
          if (state_seq[uVar26].n_next != 0) {
            puVar13 = state_seq[uVar26].next_state;
            uVar25 = 0;
            do {
              uVar29 = puVar13[uVar25];
              uVar31 = (ulong)uVar29;
              uVar28 = (uint)local_f0;
              if ((state_seq[uVar31].mixw != 0xffffffff) &&
                 (*(short *)((long)__s + uVar31 * 2) == -1)) {
                uVar4 = state_seq[uVar31].l_cb;
                uVar15 = (ulong)uVar4;
                if (uVar22 != *(uint *)((long)ptr + uVar15 * 4)) {
                  if (timers != (bw_timers_t *)0x0) {
                    ptmr_start(&timers->gau_timer);
                  }
                  prev_den_idx = (uint32 **)0x0;
                  if (uVar3 == 1) {
                    prev_den_idx = den_idx[uVar15];
                  }
                  gauden_compute_log(den[uVar15],den_idx[uVar15],feature[uVar22],g,
                                     state_seq[uVar31].cb,prev_den_idx);
                  uVar18 = (ulong)((int)uVar19 + 1);
                  cb[uVar19] = uVar4;
                  *(int *)((long)ptr + uVar15 * 4) = (int)uVar22;
                  uVar19 = uVar18;
                  if (timers != (bw_timers_t *)0x0) {
                    ptmr_stop(&timers->gau_timer);
                  }
                }
                *(short *)((long)__s + uVar31 * 2) = (short)uVar21;
                pfVar12 = active_alpha[uVar22];
                pfVar12[uVar21] = 0.0;
                *(uint *)((long)ptr_02 + (ulong)uVar21 * 4) = uVar29;
                uVar21 = uVar21 + 1;
                if (uVar21 == uVar28) {
                  local_f0 = (ulong)(uVar28 + 10);
                  pfVar12 = (float64 *)
                            __ckd_realloc__(pfVar12,local_f0 * 8,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                            ,0x1a4);
                  active_alpha[uVar22] = pfVar12;
                  uVar21 = uVar28;
                  if (bp != (uint32 **)0x0) {
                    puVar16 = (uint32 *)
                              __ckd_realloc__(bp[uVar22],local_f0 * 4,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                              ,0x1a8);
                    bp[uVar22] = puVar16;
                    local_100 = __ckd_realloc__(local_100,local_f0 * 8,
                                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                                ,0x1ab);
                    puVar7 = bp[uVar22];
                    puVar16 = puVar7 + (local_f0 - 10);
                    puVar16[0] = 0;
                    puVar16[1] = 0;
                    puVar16[2] = 0;
                    puVar16[3] = 0;
                    puVar16 = puVar7 + (local_f0 - 6);
                    puVar16[0] = 0;
                    puVar16[1] = 0;
                    puVar16[2] = 0;
                    puVar16[3] = 0;
                    (puVar7 + (local_f0 - 2))[0] = 0;
                    (puVar7 + (local_f0 - 2))[1] = 0;
                    puVar2 = (undefined8 *)((long)local_100 + local_f0 * 8 + -0x50);
                    *puVar2 = 0;
                    puVar2[1] = 0;
                    puVar2 = (undefined8 *)((long)local_100 + local_f0 * 8 + -0x40);
                    *puVar2 = 0;
                    puVar2[1] = 0;
                    puVar2 = (undefined8 *)((long)local_100 + local_f0 * 8 + -0x30);
                    *puVar2 = 0;
                    puVar2[1] = 0;
                    puVar2 = (undefined8 *)((long)local_100 + local_f0 * 8 + -0x20);
                    *puVar2 = 0;
                    puVar2[1] = 0;
                    puVar2 = (undefined8 *)((long)local_100 + local_f0 * 8 + -0x10);
                    *puVar2 = 0;
                    puVar2[1] = 0;
                  }
                }
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 < state_seq[uVar26].n_next);
          }
          sVar14 = sVar14 + 1;
        } while (sVar14 != n_elem);
        pfVar12 = gauden_scale_densities_fwd(den,den_idx,cb,(uint32)uVar19,g);
        dscale[uVar22] = pfVar12;
        if (uVar23 != 0) {
          sVar14 = 0;
          do {
            uVar23 = ptr_01[sVar14];
            uVar26 = state_seq[uVar23].n_next;
            if (uVar26 != 0) {
              puVar13 = state_seq[uVar23].next_state;
              pfVar6 = state_seq[uVar23].next_tprob;
              dVar35 = (double)active_alpha[uVar22 - 1][sVar14];
              uVar19 = 0;
              do {
                uVar25 = (ulong)puVar13[uVar19];
                if ((ulong)state_seq[uVar25].mixw != 0xffffffff) {
                  fVar8 = gauden_mixture(den[state_seq[uVar25].l_cb],den_idx[state_seq[uVar25].l_cb]
                                         ,pppfVar5[state_seq[uVar25].mixw],g);
                  uVar32 = SUB84(fVar8,0);
                  uVar33 = (undefined4)((ulong)fVar8 >> 0x20);
                  ptr_00[uVar25] = (double)fVar8;
                  dVar34 = (double)(float)pfVar6[uVar19] * dVar35;
                  uVar31 = (ulong)*(ushort *)((long)__s + uVar25 * 2);
                  if ((bp != (uint32 **)0x0) &&
                     (pdVar1 = (double *)((long)local_100 + uVar31 * 8),
                     *pdVar1 <= dVar34 && dVar34 != *pdVar1)) {
                    *(double *)((long)local_100 + uVar31 * 8) = dVar34;
                    bp[uVar22][uVar31] = (uint32)sVar14;
                    uVar32 = SUB84(ptr_00[uVar25],0);
                    uVar33 = (undefined4)((ulong)ptr_00[uVar25] >> 0x20);
                  }
                  active_alpha[uVar22][uVar31] =
                       (float64)(dVar34 * (double)CONCAT44(uVar33,uVar32) +
                                (double)active_alpha[uVar22][uVar31]);
                  uVar26 = state_seq[uVar23].n_next;
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 < uVar26);
            }
            sVar14 = sVar14 + 1;
          } while (sVar14 != n_elem);
        }
        if (uVar21 == 0) goto LAB_0010870e;
        uVar19 = 0;
        do {
          uVar23 = *(uint *)((long)ptr_02 + uVar19 * 4);
          uVar26 = state_seq[uVar23].n_next;
          if (uVar26 != 0) {
            puVar13 = state_seq[uVar23].next_state;
            pfVar6 = state_seq[uVar23].next_tprob;
            uVar25 = 0;
            do {
              uVar29 = puVar13[uVar25];
              uVar31 = (ulong)uVar29;
              if (state_seq[uVar31].mixw == 0xffffffff) {
                pfVar12 = active_alpha[uVar22];
                dVar35 = (double)(float)pfVar6[uVar25] * (double)pfVar12[uVar19];
                uVar27 = *(ushort *)((long)__s + uVar31 * 2);
                uVar15 = (ulong)uVar27;
                if (uVar15 == 0xffff) {
                  uVar27 = (ushort)uVar21;
                  *(ushort *)((long)__s + uVar31 * 2) = uVar27;
                  pfVar12[uVar21] = 0.0;
                  *(uint *)((long)ptr_02 + (ulong)uVar21 * 4) = uVar29;
                  uVar29 = uVar21 + 1;
                  uVar26 = (uint)local_f0;
                  if (uVar29 == uVar26) {
                    local_f0 = (ulong)(uVar26 + 10);
                    pfVar12 = (float64 *)
                              __ckd_realloc__(pfVar12,local_f0 * 8,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                              ,0x21c);
                    active_alpha[uVar22] = pfVar12;
                    if (bp == (uint32 **)0x0) {
                      uVar27 = *(ushort *)((long)__s + uVar31 * 2);
                      uVar21 = uVar26;
                    }
                    else {
                      puVar16 = (uint32 *)
                                __ckd_realloc__(bp[uVar22],local_f0 * 4,
                                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                                ,0x21f);
                      bp[uVar22] = puVar16;
                      local_100 = __ckd_realloc__(local_100,local_f0 * 8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                                  ,0x221);
                      puVar7 = bp[uVar22];
                      puVar16 = puVar7 + (local_f0 - 10);
                      puVar16[0] = 0;
                      puVar16[1] = 0;
                      puVar16[2] = 0;
                      puVar16[3] = 0;
                      puVar16 = puVar7 + (local_f0 - 6);
                      puVar16[0] = 0;
                      puVar16[1] = 0;
                      puVar16[2] = 0;
                      puVar16[3] = 0;
                      (puVar7 + (local_f0 - 2))[0] = 0;
                      (puVar7 + (local_f0 - 2))[1] = 0;
                      puVar2 = (undefined8 *)((long)local_100 + local_f0 * 8 + -0x50);
                      *puVar2 = 0;
                      puVar2[1] = 0;
                      puVar2 = (undefined8 *)((long)local_100 + local_f0 * 8 + -0x40);
                      *puVar2 = 0;
                      puVar2[1] = 0;
                      puVar2 = (undefined8 *)((long)local_100 + local_f0 * 8 + -0x30);
                      *puVar2 = 0;
                      puVar2[1] = 0;
                      puVar2 = (undefined8 *)((long)local_100 + local_f0 * 8 + -0x20);
                      *puVar2 = 0;
                      puVar2[1] = 0;
                      puVar2 = (undefined8 *)((long)local_100 + local_f0 * 8 + -0x10);
                      *puVar2 = 0;
                      puVar2[1] = 0;
                      uVar31 = (ulong)*(ushort *)((long)__s + uVar31 * 2);
                      local_f0 = (ulong)(uVar26 + 10);
LAB_00108245:
                      bp[uVar22][uVar31 & 0xffff] = (uint32)uVar19;
                      *(double *)((long)local_100 + (uVar31 & 0xffff) * 8) = dVar35;
                      uVar27 = (ushort)uVar31;
                      uVar21 = uVar29;
                    }
                  }
                  else {
                    uVar31 = (ulong)uVar21;
                    uVar21 = uVar29;
                    if (bp != (uint32 **)0x0) goto LAB_00108245;
                  }
                }
                else if ((bp != (uint32 **)0x0) &&
                        (pdVar1 = (double *)((long)local_100 + uVar15 * 8),
                        *pdVar1 <= dVar35 && dVar35 != *pdVar1)) {
                  bp[uVar22][uVar15] = (uint32)uVar19;
                  *(double *)((long)local_100 + uVar15 * 8) = dVar35;
                }
                active_alpha[uVar22][uVar27] =
                     (float64)(dVar35 + (double)active_alpha[uVar22][uVar27]);
                uVar26 = state_seq[uVar23].n_next;
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 < uVar26);
          }
          uVar19 = uVar19 + 1;
          uVar25 = (ulong)uVar21;
        } while (uVar19 < uVar25);
        if (uVar21 == 0) goto LAB_0010870e;
        uVar19 = 0;
        dVar35 = 0.0;
        do {
          dVar34 = (double)active_alpha[uVar22][uVar19];
          if ((double)active_alpha[uVar22][uVar19] <= dVar35) {
            dVar34 = dVar35;
          }
          uVar19 = uVar19 + 1;
          dVar35 = dVar34;
        } while (uVar25 != uVar19);
        if ((dVar34 == 0.0) && (!NAN(dVar34))) {
          forward_cold_1();
          goto LAB_0010872d;
        }
        if (dVar34 < 1e-300) goto LAB_0010870e;
        if (uVar21 == 0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                  ,0x26a,"No active states at time %u\n");
          goto LAB_0010872d;
        }
        scale[uVar22] = (float64)(1.0 / dVar34);
        dVar35 = log10(dVar34);
        dVar9 = log10((double)beam);
        n_elem = 0;
        if (local_e8 == (s3phseg_t *)0x0) {
          bVar30 = false;
        }
        else {
          uVar19 = 0;
          do {
            aVar10 = acmod_set_base_phone
                               (acmod_set,state_seq[*(uint *)((long)ptr_02 + uVar19 * 4)].phn);
            aVar11 = acmod_set_base_phone(acmod_set,local_e8->phone);
            uVar31 = uVar19;
            if (aVar10 == aVar11) break;
            uVar19 = uVar19 + 1;
            uVar31 = uVar25;
          } while (uVar25 != uVar19);
          bVar30 = (uint)uVar31 != uVar21;
        }
        uVar31 = -(ulong)(-300.0 < dVar35 + dVar9);
        puVar13 = (uint32 *)
                  __ckd_calloc__(uVar25,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/forward.c"
                                 ,0x293);
        active_astate[uVar22] = puVar13;
        uVar19 = 0;
        do {
          if ((bp != (uint32 **)0x0) &&
             (state_seq[*(uint *)((long)ptr_02 + uVar19 * 4)].mixw == 0xffffffff)) {
            bp[uVar22][uVar19] = *(uint32 *)((long)ptr_02 + (ulong)bp[uVar22][uVar19] * 4);
          }
          if ((bool)(local_e8 != (s3phseg_t *)0x0 & bVar30)) {
            aVar10 = acmod_set_base_phone
                               (acmod_set,state_seq[*(uint *)((long)ptr_02 + uVar19 * 4)].phn);
            aVar11 = acmod_set_base_phone(acmod_set,local_e8->phone);
            if (aVar10 == aVar11) {
              active_alpha[uVar22][n_elem] =
                   (float64)((double)active_alpha[uVar22][uVar19] * (double)scale[uVar22]);
              uVar24 = *(uint32 *)((long)ptr_02 + uVar19 * 4);
              active_astate[uVar22][n_elem] = uVar24;
              ptr_01[n_elem] = uVar24;
              if (bp != (uint32 **)0x0) {
                bp[uVar22][n_elem] = bp[uVar22][uVar19];
              }
              *(short *)((long)__s + (ulong)*(uint *)((long)ptr_02 + uVar19 * 4) * 2) =
                   (short)n_elem;
              n_elem = (size_t)((int)n_elem + 1);
            }
            else {
              *(undefined2 *)((long)__s + (ulong)*(uint *)((long)ptr_02 + uVar19 * 4) * 2) = 0xffff;
            }
          }
          else {
            dVar35 = (double)active_alpha[uVar22][uVar19];
            if (dVar35 <= (double)(~uVar31 & 0x1a56e1fc2f8f359 |
                                  (ulong)(dVar34 * (double)beam) & uVar31)) {
              *(undefined2 *)((long)__s + (ulong)*(uint *)((long)ptr_02 + uVar19 * 4) * 2) = 0xffff;
            }
            else {
              active_alpha[uVar22][n_elem] = (float64)(dVar35 * (double)scale[uVar22]);
              uVar24 = *(uint32 *)((long)ptr_02 + uVar19 * 4);
              active_astate[uVar22][n_elem] = uVar24;
              ptr_01[n_elem] = uVar24;
              if (bp != (uint32 **)0x0) {
                bp[uVar22][n_elem] = bp[uVar22][uVar19];
              }
              *(short *)((long)__s + (ulong)*(uint *)((long)ptr_02 + uVar19 * 4) * 2) =
                   (short)n_elem;
              n_elem = (size_t)((int)n_elem + 1);
            }
          }
          uVar19 = uVar19 + 1;
        } while (uVar25 != uVar19);
        uVar24 = (uint32)n_elem;
        if (uVar24 != 0) {
          sVar14 = 0;
          do {
            if ((bp != (uint32 **)0x0) && (state_seq[(uint)ptr_01[sVar14]].mixw == 0xffffffff)) {
              bp[uVar22][sVar14] = (uint)*(ushort *)((long)__s + (ulong)bp[uVar22][sVar14] * 2);
            }
            sVar14 = sVar14 + 1;
          } while (n_elem != sVar14);
          if (uVar24 != 0) {
            sVar14 = 0;
            do {
              *(undefined2 *)((long)__s + (ulong)(uint)ptr_01[sVar14] * 2) = 0xffff;
              sVar14 = sVar14 + 1;
            } while (n_elem != sVar14);
          }
        }
        n_active_astate[uVar22] = uVar24;
        uVar20 = uVar20 + uVar24;
        uVar22 = uVar22 + 1;
        phseg = local_e8;
      } while (uVar22 != n_obs);
      iVar17 = 0;
    }
LAB_00108741:
    if (mmi_train == 0) {
      printf(" %u ",(ulong)uVar20 / (ulong)n_obs,(ulong)uVar20 % (ulong)n_obs);
    }
  }
  ckd_free(ptr_01);
  ckd_free(ptr_02);
  ckd_free(__s);
  ckd_free(cb);
  ckd_free(ptr);
  ckd_free(ptr_00);
  ckd_free(local_100);
  ckd_free_3d(den);
  ckd_free_3d(den_idx);
  return iVar17;
}

Assistant:

int32
forward(float64 **active_alpha,
	uint32 **active_astate,
	uint32 *n_active_astate,
	uint32 **bp,
	float64 *scale,
	float64 **dscale,
	vector_t **feature,
	uint32 n_obs,
	state_t *state_seq,
	uint32 n_state,
	model_inventory_t *inv,
	float64 beam,
	s3phseg_t *phseg,
	bw_timers_t *timers,
	uint32 mmi_train)
{
    uint32 i, j, s, t, u;
    uint32 l_cb;
    uint32 *active_a;
    uint32 *active_b;
    uint32 *active;
    uint32 *active_l_cb;
    uint32 n_active;
    uint32 n_active_l_cb;
    uint32 n_sum_active;
    uint32 *next_active;
    uint32 n_next_active;
    uint32 aalpha_alloc;
    uint16 *amap;
    uint32 *next;
    float32 *tprob;
    float64 prior_alpha;
    float32 ***mixw;
    gauden_t *g;
    acmod_set_t *as;
    float64 x;
    float64 pthresh = 1e-300;
    float64 balpha;
    float64 ***now_den;
    uint32 ***now_den_idx;
    uint32 retval = S3_SUCCESS;
    uint32 n_l_cb;
    int32 *acbframe; /* Frame in which a codebook was last active */
    float64 *outprob;
    /* Can we prune this frame using phseg? */
    int can_prune_phseg;
    float64 *best_pred = NULL;
    
    /* # of distinct codebooks referenced by this utterance */
    n_l_cb = inv->n_cb_inverse;

    /* active codebook frame index */
    acbframe = ckd_calloc(n_l_cb, sizeof(*acbframe));

    g = inv->gauden;
    as = inv->mdef->acmod_set;
    /* density values and indices (for top-N eval) for some time t */
    now_den = (float64 ***)ckd_calloc_3d(n_l_cb, gauden_n_feat(g), gauden_n_top(g),
					 sizeof(float64));
    now_den_idx = (uint32 ***)ckd_calloc_3d(n_l_cb, gauden_n_feat(g), gauden_n_top(g),
					    sizeof(uint32));
    /* Mixing weight array */
    mixw = inv->mixw;

    /* Scratch area for output probabilities at some time t */
    outprob = (float64 *)ckd_calloc(n_state, sizeof(float64));

    /* Active state lists for time t and t+1 */
    active_a = ckd_calloc(n_state, sizeof(uint32));
    active_b = ckd_calloc(n_state, sizeof(uint32));

    /* Active (local) codebooks for some time t */
    active_l_cb = ckd_calloc(n_state, sizeof(uint32));

    /* Mapping from sentence HMM state index to active state list index
    * for currently active time. */
    amap = ckd_calloc(n_state, sizeof(uint16));
    
    /* set up the active and next_active lists and associated counts */
    active = active_a;
    next_active = active_b;
    n_active = 0;
    n_active_l_cb = 0;
    n_sum_active = 0;
    n_next_active = 0;

    /* Initialize the active state map such that all states are inactive */
    for (i = 0; i < n_state; i++)
	amap[i] = INACTIVE;

    /*
     * The following section computes the output liklihood of
     * the initial state for t == 0 and puts the initial state
     * in the active state list.
     */

    if (timers)
	ptmr_start(&timers->gau_timer);

    /* compute alpha for the initial state at t == 0 */
    /* Compute the component Gaussians for state 0 mixture density */
    gauden_compute_log(now_den[state_seq[0].l_cb],
		       now_den_idx[state_seq[0].l_cb],
		       feature[0],
		       g,
		       state_seq[0].cb, NULL);

    active_l_cb[0] = state_seq[0].l_cb;

    dscale[0] = gauden_scale_densities_fwd(now_den, now_den_idx,
					   active_l_cb, 1, g);

    /* Compute the mixture density value for state 0 time 0 */
    outprob[0] = gauden_mixture(now_den[state_seq[0].l_cb],
				now_den_idx[state_seq[0].l_cb],
				mixw[state_seq[0].mixw],
				g);
    if (timers)
	ptmr_stop(&timers->gau_timer);
    if (outprob[0] <= MIN_IEEE_NORM_POS_FLOAT32) {
	E_ERROR("Small output prob (== %.2e) seen at frame 0 state 0\n", outprob[0]);

	retval = S3_ERROR;
	
	goto cleanup;
    }

    /*
     * Allocate space for the initial state in the alpha
     * and active state arrays
     */
    active_alpha[0] = ckd_calloc(1, sizeof(float64));
    active_astate[0] = ckd_calloc(1, sizeof(uint32));
    if (bp)
	bp[0] = ckd_calloc(1, sizeof(uint32)); /* Unused, actually */
    aalpha_alloc = 1;

    /*
     * Allocate the bestscore array for embedded Viterbi
     */
    if (bp)
	best_pred = ckd_calloc(1, sizeof(float64));

    /* Compute scale for t == 0 */
    scale[0] = 1.0 / outprob[0];

    /* set the scaled alpha variable for the initial state */
    active_alpha[0][0] = 1.0;
    /* put the initial state in the active state array for t == 0 */
    active_astate[0][0] = 0;
    /* Only one initial state (for now) */
    n_active_astate[0] = 1;

    /* insert the initial state in the active list */
    active[n_active] = 0;
    n_active++;

    /* Compute scaled alpha over all remaining time in the utterance */
    for (t = 1; t < n_obs; t++) {
	/* Find active phone for this timepoint. */
	if (phseg) {
	    /* Move the pointer forward if necessary. */
	    if (t > phseg->ef)
		phseg = phseg->next;
	}
	n_active_l_cb = 0;

	/* assume next active state set about the same size as current;
	   adjust to actual size as necessary later */
	active_alpha[t] = (float64 *)ckd_calloc(n_active, sizeof(float64));
	if (bp) {
	    bp[t] = (uint32 *)ckd_calloc(n_active, sizeof(uint32));
	    /* reallocate the best score array and zero it out */
	    if (n_active > aalpha_alloc)
		best_pred = (float64 *)ckd_realloc(best_pred, n_active * sizeof(float64));
	    memset(best_pred, 0, n_active * sizeof(float64));
	}
	aalpha_alloc = n_active;

	/* For all active states at the previous frame, activate their
	   successors in this frame and compute codebooks. */
	/* (these are pre-computed so they can be scaled to avoid underflows) */
	for (s = 0; s < n_active; s++) {
	    i = active[s];
#if FORWARD_DEBUG
	    E_INFO("At time %d, In Gaussian computation, active state %d\n",t, i);
#endif
	    /* get list of states adjacent to active state i */
	    next = state_seq[i].next_state;	

	    /* activate them all, computing their codebook densities if necessary */
	    for (u = 0; u < state_seq[i].n_next; u++) {
		j = next[u];
#if FORWARD_DEBUG
		E_INFO("In Gaussian computation, active state %d, next state %d\n", i,j);
#endif
		if (state_seq[j].mixw != TYING_NON_EMITTING) {
		    if (amap[j] == INACTIVE) {
			l_cb = state_seq[j].l_cb;
			
			if (acbframe[l_cb] != t) {
			    /* Component density values not yet computed */
			    if (timers)
				ptmr_start(&timers->gau_timer);
			    gauden_compute_log(now_den[l_cb],
					       now_den_idx[l_cb],
					       feature[t],
					       g,
					       state_seq[j].cb,
					       /* Preinitializing topn
						  only really makes a
						  difference for
						  semi-continuous
						  (n_l_cb == 1)
						  models. */
					       n_l_cb == 1
					       ? now_den_idx[l_cb] : NULL);

			    active_l_cb[n_active_l_cb++] = l_cb;
			    acbframe[l_cb] = t;

			    if (timers)
				ptmr_stop(&timers->gau_timer);
			}

			/* Put next state j into the active list */
			amap[j] = n_next_active;

			/* Initialize the alpha variable to zero */
			active_alpha[t][n_next_active] = 0;

			/* Map active state list index to sentence HMM index */
			next_active[n_next_active] = j;

			++n_next_active;

			if (n_next_active == aalpha_alloc) {
			    /* Need to reallocate the active_alpha array */
			    aalpha_alloc += ACHK;
			    active_alpha[t] = ckd_realloc(active_alpha[t],
							  sizeof(float64) * aalpha_alloc);
			    /* And the backpointer array */
			    if (bp) {
				bp[t] = ckd_realloc(bp[t],
						    sizeof(uint32) * aalpha_alloc);
				/* And the best score array */
				best_pred = (float64 *)ckd_realloc(best_pred,
								   sizeof(float64) * aalpha_alloc);
				/* Make sure the new stuff is zero */
				memset(bp[t] + aalpha_alloc - ACHK,
				       0, sizeof(uint32) * ACHK);
				memset(best_pred + aalpha_alloc - ACHK,
				       0, sizeof(float64) * ACHK);
			    }
			}
		    }
		}
	    }
	}

	/* Cope w/ numerical issues by dividing densities by max density */
	dscale[t] = gauden_scale_densities_fwd(now_den, now_den_idx,
					       active_l_cb, n_active_l_cb, g);
	
	/* Now, for all active states in the previous frame, compute
	   alpha for all successors in this frame. */
	for (s = 0; s < n_active; s++) {
	    i = active[s];
	    
#if FORWARD_DEBUG
	    E_INFO("At time %d, In real state alpha update, active state %d\n",t, i);
#endif
	    /* get list of states adjacent to active state i */
	    next = state_seq[i].next_state;	
	    /* get the associated transition probs */
	    tprob = state_seq[i].next_tprob;

	    /* the scaled alpha value for i at t-1 */
	    prior_alpha = active_alpha[t-1][s];

	    /* For all emitting states j adjacent to i, update their
	     * alpha values.  */
	    for (u = 0; u < state_seq[i].n_next; u++) {
		j = next[u];
#if FORWARD_DEBUG
		E_INFO("In real state update, active state %d, next state %d\n", i,j);
#endif
		l_cb = state_seq[j].l_cb;

		if (state_seq[j].mixw != TYING_NON_EMITTING) {
		    /* Next state j is an emitting state */
		    outprob[j] = gauden_mixture(now_den[l_cb],
						now_den_idx[l_cb],
						mixw[state_seq[j].mixw],
						g);


		    /* update backpointers bp[t][j] */
		    x = prior_alpha * tprob[u];
		    if (bp) {
			if (x > best_pred[amap[j]]) {
#if FORWARD_DEBUG
			    E_INFO("In real state update, backpointer %d => %d updated from %e to (%e * %e = %e)\n",
				   i, j, best_pred[amap[j]], prior_alpha, tprob[u], x);
#endif
			    best_pred[amap[j]] = x;
			    bp[t][amap[j]] = s;
			}
		    }
		    
		    /* update the unscaled alpha[t][j] */
		    active_alpha[t][amap[j]] += x * outprob[j];
		}
		else {
		    /* already done below in the prior time frame */
		}
	    }
	}

#if FORWARD_DEBUG
	if (bp) {
	    for (s = 0; s < n_next_active; ++s) {
		j = next_active[s];
		E_INFO("After real state update, best path to %d(%d) = %d(%d)\n",
		       j, amap[j], active[bp[t][s]], bp[t][s]);
	    }
	}
#endif
	/* Now, for all active states in this frame, consume any
	   following non-emitting states (multiplying in their
	   transition probabilities)  */
	for (s = 0; s < n_next_active; s++) {
	    i = next_active[s];

	    /* find the successor states */
	    next = state_seq[i].next_state;
	    tprob = state_seq[i].next_tprob;

	    for (u = 0; u < state_seq[i].n_next; u++) {
		j = next[u];
		/* for any non-emitting ones */
		if (state_seq[j].mixw == TYING_NON_EMITTING) {
#if FORWARD_DEBUG
		    E_INFO("In non-emitting state update, active state %d, next state %d\n",i,j);
#endif
		    x = active_alpha[t][s] * tprob[u];

#if FORWARD_DEBUG
		    E_INFO("In non-emitting state update, active_alpha[t][s]: %f,tprob[u]:  %f\n",active_alpha[t][s],tprob[u]);
#endif
		    /* activate this state if necessary */
		    if (amap[j] == INACTIVE) {
			amap[j] = n_next_active;
			active_alpha[t][n_next_active] = 0;
			next_active[n_next_active] = j;
			++n_next_active;

			if (n_next_active == aalpha_alloc) {
			    aalpha_alloc += ACHK;
			    active_alpha[t] = ckd_realloc(active_alpha[t],
							  sizeof(float64) * aalpha_alloc);
			    if (bp) {
				bp[t] = ckd_realloc(bp[t],
						    sizeof(uint32) * aalpha_alloc);
				best_pred = (float64 *)ckd_realloc(best_pred,
								   sizeof(float64) * aalpha_alloc);
				memset(bp[t] + aalpha_alloc - ACHK,
				       0, sizeof(uint32) * ACHK);
				memset(best_pred + aalpha_alloc - ACHK,
				       0, sizeof(float64) * ACHK);
			    }
			}
			if (bp) {
			    /* Give its backpointer a default value */
			    bp[t][amap[j]] = s;
			    best_pred[amap[j]] = x;
			}
		    }

		    /* update backpointers bp[t][j] */
		    if (bp && x > best_pred[amap[j]]) {
			bp[t][amap[j]] = s;
			best_pred[amap[j]] = x;
		    }
		    /* update its alpha value */
		    active_alpha[t][amap[j]] += x;
		}
	    }
	}

#if FORWARD_DEBUG
	for (s = 0; s < n_next_active; ++s) {
	    j = next_active[s];
	    if (bp && state_seq[j].mixw == TYING_NON_EMITTING) {
		E_INFO("After non-emitting state update, best path to %d(%d) = %d(%d)\n",
		       j, amap[j], next_active[bp[t][s]], bp[t][s]);
		/* Assumptions about topology that might not be valid
		 * but are useful for debugging. */
		assert(next_active[bp[t][s]] <= j);
		assert(j - next_active[bp[t][s]] <= 2);
	    }
	}
#endif
	/* find best alpha value in current frame for pruning and scaling purposes */
	balpha = 0;
	/* also take the argmax to find the best backtrace */
	for (s = 0; s < n_next_active; s++) {
	    if (balpha < active_alpha[t][s]) {
		balpha = active_alpha[t][s];
	    }
	}

	/* cope with some pathological case */
	if (balpha == 0.0 && n_next_active > 0) {
	    E_ERROR("All %u active states,", n_next_active);
	    for (s = 0; s < n_next_active; s++) {
		if (state_seq[next_active[s]].mixw != TYING_NON_EMITTING)
		    fprintf(stderr, " %u", state_seq[next_active[s]].mixw);
		else
		    fprintf(stderr, " N(%u,%u)",
			    state_seq[next_active[s]].tmat, state_seq[next_active[s]].m_state);

	    }
	    fprintf(stderr, ", zero at time %u\n", t);
	    fflush(stderr);
	    retval =  S3_ERROR;
	    break;
	}

	/* and some related pathological cases */
	if (balpha < 1e-300) {
	    E_ERROR("Best alpha < 1e-300\n");

	    retval = S3_ERROR;

	    break;
	}
	if (n_next_active == 0) {
	    E_ERROR("No active states at time %u\n", t);
	    retval = S3_ERROR;
	    break;
	}

	/* compute the scale factor */
	scale[t] = 1.0 / balpha;
	/* compute the pruning threshold based on the beam */
	if (log10(balpha) + log10(beam) > -300) {
	    pthresh = balpha * beam;
	}
	else {
	    /* avoiding underflow... */
	    pthresh = 1e-300;
	}
/* DEBUG XXXXX */
/* pthresh = 0.0; */
/* END DEBUG */

	/* Determine if phone segmentation-based pruning would leave
	 * us with an empty active list (that would be bad!) */
	can_prune_phseg = 0;
	if (phseg) {
	    for (s = 0; s < n_next_active; ++s) 
		if (acmod_set_base_phone(as, state_seq[next_active[s]].phn)
		    == acmod_set_base_phone(as, phseg->phone))
		    break;
	    can_prune_phseg = !(s == n_next_active);
#if FORWARD_DEBUG
	    if (!can_prune_phseg) {
		E_INFO("Will not apply phone-based pruning at timepoint %d "
		       "(%d != %d) (%s != %s)\n", t,
		       state_seq[next_active[s]].phn,
		       phseg->phone,
		       acmod_set_id2name(inv->mdef->acmod_set, state_seq[next_active[s]].phn),
		       acmod_set_id2name(inv->mdef->acmod_set, phseg->phone)
		       );
	    }
#endif
	}
	/* Prune active states for the next frame and rescale their alphas. */
	active_astate[t] = ckd_calloc(n_next_active, sizeof(uint32));
	for (s = 0, n_active = 0; s < n_next_active; s++) {
	    /* "Snap" the backpointers for non-emitting states, so
	       that they don't point to bogus indices (we will use
	       amap to recover them). */
	    if (bp && state_seq[next_active[s]].mixw == TYING_NON_EMITTING) {
#if FORWARD_DEBUG
		E_INFO("Snapping backpointer for %d, %d => %d\n",
		       next_active[s], bp[t][s], next_active[bp[t][s]]);
#endif
		bp[t][s] = next_active[bp[t][s]];
	    }
	    /* If we have a phone segmentation, use it instead of the beam. */
	    if (phseg && can_prune_phseg) {
		if (acmod_set_base_phone(as, state_seq[next_active[s]].phn)
		    == acmod_set_base_phone(as, phseg->phone)) {
		    active_alpha[t][n_active] = active_alpha[t][s] * scale[t];
		    active[n_active] = active_astate[t][n_active] = next_active[s];
		    if (bp)
			bp[t][n_active] = bp[t][s];
		    amap[next_active[s]] = n_active;
		    n_active++;
		}
		else {
		    amap[next_active[s]] = INACTIVE;
		}
	    }
	    else {
		if (active_alpha[t][s] > pthresh) {
		    active_alpha[t][n_active] = active_alpha[t][s] * scale[t];
		    active[n_active] = active_astate[t][n_active] = next_active[s];
		    if (bp)
			bp[t][n_active] = bp[t][s];
		    amap[next_active[s]] = n_active;
		    n_active++;
		}
		else {
		    amap[next_active[s]] = INACTIVE;
		}
	    }
	}
	/* Now recover the backpointers for non-emitting states. */
	for (s = 0; s < n_active; ++s) {
	    if (bp && state_seq[active[s]].mixw == TYING_NON_EMITTING) {
#if FORWARD_DEBUG
		E_INFO("Snapping backpointer for %d, %d => %d(%d)\n",
		       active[s], bp[t][s], amap[bp[t][s]], active[amap[bp[t][s]]]);
#endif
		bp[t][s] = amap[bp[t][s]];
	    }
	}
	/* And finally deactive all states. */
	for (s = 0; s < n_active; ++s) {
	    amap[active[s]] = INACTIVE;
	}
	n_active_astate[t] = n_active;
	n_next_active = 0;

	n_sum_active += n_active;
    }
    if (!mmi_train)
	printf(" %u ", n_sum_active / n_obs);
    
cleanup:
    ckd_free(active_a);
    ckd_free(active_b);
    ckd_free(amap);

    ckd_free(active_l_cb);
    ckd_free(acbframe);

    ckd_free(outprob);
    ckd_free(best_pred);

    ckd_free_3d((void ***)now_den);
    ckd_free_3d((void ***)now_den_idx);

    return retval;
}